

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBoxShadow.cpp
# Opt level: O3

void __thiscall
Rml::GeometryBoxShadow::Generate
          (GeometryBoxShadow *this,Geometry *out_shadow_geometry,CallbackTexture *out_shadow_texture
          ,RenderManager *render_manager,Element *element,Geometry *background_border_geometry,
          BoxShadowList *shadow_list,CornerSizes border_radius,float opacity)

{
  RenderManager *pRVar1;
  undefined8 uVar2;
  Vector2f b;
  Vector2f dimensions;
  Vector2f b_00;
  Vector2f origin;
  undefined1 auVar3 [8];
  Vector2Type VVar4;
  int iVar5;
  int iVar6;
  BoxShadowList *__range1;
  BoxShadow *shadow;
  RenderManager *pRVar7;
  Vector2f a;
  Vector2f VVar8;
  pointer extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar9;
  float fVar10;
  float fVar11;
  Mesh mesh;
  undefined1 local_118 [8];
  Vector2f VStack_110;
  Vector2f local_108;
  undefined8 uStack_100;
  float local_ec;
  float local_e8;
  float fStack_e4;
  undefined8 uStack_e0;
  undefined1 local_d8 [24];
  Vector2Type local_c0;
  Vector2Type local_b8;
  Element *local_b0;
  undefined1 local_a8 [24];
  pointer local_90;
  pointer local_80;
  undefined8 *local_78;
  undefined8 uStack_70;
  code *local_68;
  code *pcStack_60;
  Vector2i local_58;
  undefined1 local_48 [16];
  
  local_58 = border_radius._M_elems._0_8_;
  local_48._8_4_ = in_XMM1_Dc;
  local_48._0_8_ = border_radius._M_elems._8_8_;
  local_48._12_4_ = in_XMM1_Dd;
  pRVar7 = (background_border_geometry->
           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
           ).render_manager;
  pRVar1 = *(RenderManager **)
            &(background_border_geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle;
  local_d8._0_16_ = ZEXT816(0);
  fVar9 = 0.0;
  fVar10 = 0.0;
  uStack_100._0_4_ = 0.0;
  uStack_100._4_4_ = 0.0;
  local_ec = opacity;
  VVar4 = (Vector2Type)this;
  local_b8 = (Vector2Type)out_shadow_geometry;
  local_b0 = element;
  if (pRVar7 != pRVar1) {
    do {
      local_c0 = VVar4;
      fVar9 = Element::ResolveLength
                        ((Element *)render_manager,
                         *(NumericValue *)
                          ((long)&(pRVar7->geometry_list).elements.
                                  super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                  ._M_impl.super__Vector_impl_data + 0xc));
      *(float *)((long)&(pRVar7->geometry_list).elements.
                        super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                        ._M_impl.super__Vector_impl_data + 0xc) = fVar9;
      *(undefined4 *)
       ((long)&(pRVar7->geometry_list).elements.
               super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
               ._M_impl.super__Vector_impl_data + 0x10) = 0x40;
      fVar9 = Element::ResolveLength
                        ((Element *)render_manager,
                         *(NumericValue *)
                          ((long)&(pRVar7->geometry_list).elements.
                                  super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                  ._M_impl.super__Vector_impl_data + 0x14));
      *(float *)((long)&(pRVar7->geometry_list).elements.
                        super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                        ._M_impl.super__Vector_impl_data + 0x14) = fVar9;
      *(undefined4 *)
       &(pRVar7->geometry_list).free_slots.super__Bvector_base<std::allocator<bool>_>._M_impl.
        super__Bvector_impl_data._M_start.super__Bit_iterator_base = 0x40;
      fVar9 = Element::ResolveLength
                        ((Element *)render_manager,
                         *(NumericValue *)((long)&pRVar7->render_interface + 4));
      *(float *)((long)&pRVar7->render_interface + 4) = fVar9;
      *(undefined4 *)
       &(pRVar7->geometry_list).elements.
        super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
        ._M_impl.super__Vector_impl_data._M_start = 0x40;
      fVar9 = Element::ResolveLength
                        ((Element *)render_manager,
                         *(NumericValue *)
                          ((long)&(pRVar7->geometry_list).elements.
                                  super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                  ._M_impl.super__Vector_impl_data + 4));
      this = (GeometryBoxShadow *)local_c0;
      *(float *)((long)&(pRVar7->geometry_list).elements.
                        super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                        ._M_impl.super__Vector_impl_data + 4) = fVar9;
      *(undefined4 *)
       ((long)&(pRVar7->geometry_list).elements.
               super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
               ._M_impl.super__Vector_impl_data + 8) = 0x40;
      pRVar7 = (RenderManager *)
               ((long)&(pRVar7->geometry_list).free_slots.super__Bvector_base<std::allocator<bool>_>
                       ._M_impl.super__Bvector_impl_data + 8);
      VVar4 = local_c0;
    } while (pRVar7 != pRVar1);
    pRVar1 = *(RenderManager **)
              &(background_border_geometry->
               super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
               ).resource_handle;
    local_d8._0_16_ = ZEXT416(0);
    fVar9 = 0.0;
    fVar10 = 0.0;
    uStack_100._0_4_ = 0.0;
    uStack_100._4_4_ = 0.0;
    for (pRVar7 = (background_border_geometry->
                  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                  ).render_manager; pRVar7 != pRVar1;
        pRVar7 = (RenderManager *)
                 ((long)&(pRVar7->geometry_list).free_slots.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 + 8)) {
      if (*(char *)((long)&(pRVar7->geometry_list).free_slots.
                           super__Bvector_base<std::allocator<bool>_>._M_impl.
                           super__Bvector_impl_data + 4) == '\0') {
        fVar11 = *(float *)((long)&(pRVar7->geometry_list).elements.
                                   super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                   ._M_impl.super__Vector_impl_data + 0xc) * 1.5 +
                 *(float *)((long)&(pRVar7->geometry_list).elements.
                                   super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                   ._M_impl.super__Vector_impl_data + 0x14);
        local_e8 = *(float *)((long)&pRVar7->render_interface + 4);
        fStack_e4 = *(float *)((long)&(pRVar7->geometry_list).elements.
                                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                      ._M_impl.super__Vector_impl_data + 4);
        uStack_e0._0_4_ = 0;
        uStack_e0._4_4_ = 0;
        a.y = fVar10;
        a.x = fVar9;
        VVar8.y = fStack_e4 - fVar11;
        VVar8.x = local_e8 - fVar11;
        local_108 = Math::Min<Rml::Vector2<float>>(a,VVar8);
        b.y = fVar11 + fStack_e4;
        b.x = fVar11 + local_e8;
        uStack_100 = extraout_XMM0_Qb;
        local_d8._0_8_ = Math::Max<Rml::Vector2<float>>((Vector2f)local_d8._0_8_,b);
        local_d8._8_8_ = extraout_XMM0_Qb_00;
        fVar9 = local_108.x;
        fVar10 = local_108.y;
      }
    }
  }
  local_108.y = fVar10;
  local_108.x = fVar9;
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 0.0;
  VStack_110.x = 0.0;
  VStack_110.y = 0.0;
  iVar5 = Element::GetNumBoxes((Element *)render_manager);
  if (0 < iVar5) {
    iVar5 = 0;
    do {
      Element::GetRenderBox((RenderBox *)local_a8,(Element *)render_manager,Border,iVar5);
      local_e8 = (float)local_a8._0_8_ + (float)local_a8._8_8_;
      fStack_e4 = SUB84(local_a8._0_8_,4) + SUB84(local_a8._8_8_,4);
      uStack_e0._0_4_ = 0;
      uStack_e0._4_4_ = 0;
      VVar8 = Math::Min<Rml::Vector2<float>>((Vector2f)local_118,(Vector2f)local_a8._8_8_);
      b_00.y = fStack_e4;
      b_00.x = local_e8;
      VStack_110 = Math::Max<Rml::Vector2<float>>(VStack_110,b_00);
      iVar5 = iVar5 + 1;
      local_118 = (undefined1  [8])VVar8;
      iVar6 = Element::GetNumBoxes((Element *)render_manager);
    } while (iVar5 < iVar6);
  }
  fVar9 = local_118._0_4_;
  fVar10 = VStack_110.x;
  VStack_110.y = (float)local_d8._4_4_ + VStack_110.y;
  local_118._4_4_ = local_108.y + local_118._4_4_;
  local_118._0_4_ = local_108.x + fVar9;
  VStack_110.x = (float)local_d8._0_4_ + fVar10;
  Math::ExpandToPixelGrid((Rectanglef *)local_118);
  local_e8 = local_118._0_4_;
  fStack_e4 = local_118._4_4_;
  uStack_e0._0_4_ = 0;
  uStack_e0._4_4_ = 0;
  local_108.x = VStack_110.x;
  local_108.y = VStack_110.y;
  uStack_100 = (pointer)0x0;
  pRVar7 = (background_border_geometry->
           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
           ).render_manager;
  uVar2 = *(undefined8 *)
           &(background_border_geometry->
            super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
            ).resource_handle;
  pRVar1 = background_border_geometry[1].
           super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
           .render_manager;
  (background_border_geometry->
  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ).render_manager = (RenderManager *)0x0;
  *(undefined8 *)
   &(background_border_geometry->
    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ).resource_handle = 0;
  background_border_geometry[1].
  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  .render_manager = (RenderManager *)0x0;
  Geometry::Release((Mesh *)local_a8,(Geometry *)this,ClearMesh);
  origin.y = fStack_e4;
  origin.x = local_e8;
  fVar9 = local_108.x - local_e8;
  fVar10 = local_108.y - fStack_e4;
  local_108.y = (float)(int)fVar10;
  local_108.x = (float)(int)fVar9;
  uStack_100 = (pointer)CONCAT44((int)(uStack_100._4_4_ - SUB84(uStack_e0,4)),
                                 (int)((float)uStack_100 - (float)uStack_e0));
  dimensions.y = (float)(int)fVar10;
  dimensions.x = (float)(int)fVar9;
  MeshUtilities::GenerateQuad
            ((Mesh *)local_a8,origin,dimensions,
             (ColourbPremultiplied)(((int)(local_ec * 255.0) & 0xffU) * 0x1010101));
  local_78 = (undefined8 *)0x0;
  uStack_70._0_4_ = 0.0;
  uStack_70._4_4_ = 0.0;
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78 = (undefined8 *)operator_new(0x48);
  *local_78 = local_b0;
  local_78[1] = render_manager;
  *(Vector2i *)(local_78 + 2) = local_58;
  local_78[3] = local_48._0_8_;
  local_78[4] = local_108;
  local_78[5] = CONCAT44(fStack_e4,local_e8) ^ 0x8000000080000000;
  local_78[6] = pRVar7;
  local_78[7] = uVar2;
  local_78[8] = pRVar1;
  pcStack_60 = ::std::
               _Function_handler<bool_(const_Rml::CallbackTextureInterface_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBoxShadow.cpp:91:26)>
               ::_M_invoke;
  local_68 = ::std::
             _Function_handler<bool_(const_Rml::CallbackTextureInterface_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBoxShadow.cpp:91:26)>
             ::_M_manager;
  RenderManager::MakeCallbackTexture
            ((RenderManager *)local_118,(CallbackTextureFunction *)out_shadow_texture);
  VVar4 = local_b8;
  CallbackTexture::Release((CallbackTexture *)local_b8);
  fVar9 = VStack_110.x;
  auVar3 = local_118;
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 0.0;
  *(undefined1 (*) [8])VVar4 = auVar3;
  VStack_110.x = -NAN;
  ((Vector2Type *)((long)VVar4 + 8))->x = fVar9;
  CallbackTexture::Release((CallbackTexture *)local_118);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,3);
  }
  RenderManager::MakeGeometry((RenderManager *)local_118,(Mesh *)out_shadow_texture);
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)this);
  auVar3 = local_118;
  local_118._0_4_ = 0.0;
  local_118._4_4_ = 0.0;
  *(undefined1 (*) [8])this = auVar3;
  fVar9 = VStack_110.x;
  VStack_110.x = -NAN;
  *(float *)((long)this + 8) = fVar9;
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)local_118);
  if (local_90 != (pointer)0x0) {
    operator_delete(local_90,(long)local_80 - (long)local_90);
  }
  if ((Vector2f)local_a8._0_8_ != (Vector2f)0x0) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ - local_a8._0_8_);
  }
  return;
}

Assistant:

void GeometryBoxShadow::Generate(Geometry& out_shadow_geometry, CallbackTexture& out_shadow_texture, RenderManager& render_manager, Element* element,
	Geometry& background_border_geometry, BoxShadowList shadow_list, const CornerSizes border_radius, const float opacity)
{
	// Find the box-shadow texture dimension and offset required to cover all box-shadows and element boxes combined.
	Vector2f element_offset_in_texture;
	Vector2i texture_dimensions;

	// Resolve all lengths to px units.
	for (BoxShadow& shadow : shadow_list)
	{
		shadow.blur_radius = NumericValue(element->ResolveLength(shadow.blur_radius), Unit::PX);
		shadow.spread_distance = NumericValue(element->ResolveLength(shadow.spread_distance), Unit::PX);
		shadow.offset_x = NumericValue(element->ResolveLength(shadow.offset_x), Unit::PX);
		shadow.offset_y = NumericValue(element->ResolveLength(shadow.offset_y), Unit::PX);
	}

	{
		Vector2f extend_min;
		Vector2f extend_max;

		// Extend the render-texture to encompass box-shadow blur and spread.
		for (const BoxShadow& shadow : shadow_list)
		{
			if (!shadow.inset)
			{
				const float extend = 1.5f * shadow.blur_radius.number + shadow.spread_distance.number;
				const Vector2f offset = {shadow.offset_x.number, shadow.offset_y.number};
				extend_min = Math::Min(extend_min, offset - Vector2f(extend));
				extend_max = Math::Max(extend_max, offset + Vector2f(extend));
			}
		}

		Rectanglef texture_region;

		// Extend the render-texture further to cover all the element's boxes.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			const RenderBox box = element->GetRenderBox(BoxArea::Border, i);
			texture_region = texture_region.Join(Rectanglef::FromPositionSize(box.GetBorderOffset(), box.GetFillSize()));
		}

		texture_region = texture_region.Extend(-extend_min, extend_max);
		Math::ExpandToPixelGrid(texture_region);

		element_offset_in_texture = -texture_region.TopLeft();
		texture_dimensions = Vector2i(texture_region.Size());
	}

	// Callback for generating the box-shadow texture. Using a callback ensures that the texture can be regenerated at any time, for example if the
	// device loses its GPU context and the client calls Rml::ReleaseTextures().
	auto texture_callback = [&background_border_geometry, element, border_radius, texture_dimensions, element_offset_in_texture,
								shadow_list = std::move(shadow_list)](const CallbackTextureInterface& texture_interface) -> bool {
		RenderManager& render_manager = texture_interface.GetRenderManager();

		Mesh mesh_padding;        // Render geometry for inner box-shadow.
		Mesh mesh_padding_border; // Clipping mask for outer box-shadow.

		bool has_inner_shadow = false;
		bool has_outer_shadow = false;
		for (const BoxShadow& shadow : shadow_list)
		{
			if (shadow.inset)
				has_inner_shadow = true;
			else
				has_outer_shadow = true;
		}

		// Generate the geometry for all the element's boxes and extend the render-texture further to cover all of them.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			ColourbPremultiplied white(255);
			if (has_inner_shadow)
				MeshUtilities::GenerateBackground(mesh_padding, element->GetRenderBox(BoxArea::Padding, i), white);
			if (has_outer_shadow)
				MeshUtilities::GenerateBackground(mesh_padding_border, element->GetRenderBox(BoxArea::Border, i), white);
		}

		const RenderState initial_render_state = render_manager.GetState();
		render_manager.ResetState();
		render_manager.SetScissorRegion(Rectanglei::FromSize(texture_dimensions));

		// The scissor region will be clamped to the current window size, check the resulting scissor region.
		const Rectanglei scissor_region = render_manager.GetScissorRegion();
		if (scissor_region.Width() <= 0 || scissor_region.Height() <= 0)
		{
			// The window may become zero-sized for example when minimized. Just skip the texture generation for now, we
			// expect to be called again later when the window is restored.
			render_manager.SetState(initial_render_state);
			return false;
		}
		if (scissor_region != Rectanglei::FromSize(texture_dimensions))
		{
			Log::Message(Log::LT_INFO,
				"The desired box-shadow texture dimensions (%d, %d) are larger than the current window region (%d, %d). "
				"Results may be clipped. In element: %s",
				texture_dimensions.x, texture_dimensions.y, scissor_region.Width(), scissor_region.Height(), element->GetAddress().c_str());
		}

		render_manager.PushLayer();

		background_border_geometry.Render(element_offset_in_texture);

		for (int shadow_index = (int)shadow_list.size() - 1; shadow_index >= 0; shadow_index--)
		{
			const BoxShadow& shadow = shadow_list[shadow_index];
			const Vector2f shadow_offset = {shadow.offset_x.number, shadow.offset_y.number};
			const bool inset = shadow.inset;
			const float spread_distance = shadow.spread_distance.number;
			const float blur_radius = shadow.blur_radius.number;

			CornerSizes spread_radii = border_radius;
			for (int i = 0; i < 4; i++)
			{
				float& radius = spread_radii[i];
				float spread_factor = (inset ? -1.f : 1.f);
				if (radius < spread_distance)
				{
					const float ratio_minus_one = (radius / spread_distance) - 1.f;
					spread_factor *= 1.f + ratio_minus_one * ratio_minus_one * ratio_minus_one;
				}
				radius = Math::Max(radius + spread_factor * spread_distance, 0.f);
			}

			Mesh mesh_shadow;

			// Generate the shadow geometry. For outer box-shadows it is rendered normally, while for inset box-shadows it is used as a clipping mask.
			for (int i = 0; i < element->GetNumBoxes(); i++)
			{
				const float signed_spread_distance = (inset ? -spread_distance : spread_distance);
				RenderBox render_box = element->GetRenderBox(inset ? BoxArea::Padding : BoxArea::Border, i);
				render_box.SetFillSize(Math::Max(render_box.GetFillSize() + Vector2f(2.f * signed_spread_distance), Vector2f{0.001f}));
				render_box.SetBorderRadius(spread_radii);
				render_box.SetBorderOffset(render_box.GetBorderOffset() - Vector2f(signed_spread_distance));
				MeshUtilities::GenerateBackground(mesh_shadow, render_box, shadow.color);
			}

			CompiledFilter blur;
			if (blur_radius >= 0.5f)
			{
				blur = render_manager.CompileFilter("blur", Dictionary{{"sigma", Variant(0.5f * blur_radius)}});
				if (blur)
					render_manager.PushLayer();
			}

			Geometry geometry_shadow = render_manager.MakeGeometry(std::move(mesh_shadow));

			if (inset)
			{
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_shadow, shadow_offset + element_offset_in_texture);

				for (Rml::Vertex& vertex : mesh_padding.vertices)
					vertex.colour = shadow.color;

				// @performance: Don't need to copy the mesh if this is the last use of it.
				Geometry geometry_padding = render_manager.MakeGeometry(Mesh(mesh_padding));
				geometry_padding.Render(element_offset_in_texture);

				render_manager.SetClipMask(ClipMaskOperation::Set, &geometry_padding, element_offset_in_texture);
			}
			else
			{
				Mesh mesh = mesh_padding_border;
				Geometry geometry_padding_border = render_manager.MakeGeometry(std::move(mesh));
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_padding_border, element_offset_in_texture);
				geometry_shadow.Render(shadow_offset + element_offset_in_texture);
			}

			if (blur)
			{
				FilterHandleList filters;
				blur.AddHandleTo(filters);
				render_manager.CompositeLayers(render_manager.GetTopLayer(), render_manager.GetNextLayer(), BlendMode::Blend, filters);
				render_manager.PopLayer();
				blur.Release();
			}
		}

		texture_interface.SaveLayerAsTexture();

		render_manager.PopLayer();
		render_manager.SetState(initial_render_state);

		return true;
	};

	Mesh mesh = out_shadow_geometry.Release(Geometry::ReleaseMode::ClearMesh);
	const byte alpha = byte(opacity * 255.f);
	MeshUtilities::GenerateQuad(mesh, -element_offset_in_texture, Vector2f(texture_dimensions), ColourbPremultiplied(alpha, alpha));

	out_shadow_texture = render_manager.MakeCallbackTexture(std::move(texture_callback));
	out_shadow_geometry = render_manager.MakeGeometry(std::move(mesh));
}